

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

rotation_t * opengv::relative_pose::rotationOnly(RelativeAdapterBase *adapter,Indices *indices)

{
  int iVar1;
  int iVar2;
  Indices *in_RDX;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RSI;
  rotation_t *in_RDI;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  PVar3;
  Vector3d fprime;
  Vector3d f;
  size_t i_1;
  MatrixXd Hcross;
  size_t i;
  Vector3d pointsCenter2;
  Vector3d pointsCenter1;
  size_t numberCorrespondences;
  MatrixXd *in_stack_00000298;
  RhsNested in_stack_fffffffffffffda8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffdb0;
  TransposeReturnType in_stack_fffffffffffffdb8;
  int *in_stack_fffffffffffffdc0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdd0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  undefined4 in_stack_fffffffffffffdd8;
  unsigned_long *in_stack_fffffffffffffe00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe08;
  undefined1 local_1c0 [72];
  undefined1 local_178 [72];
  ulong local_130;
  undefined4 local_108;
  undefined4 local_104;
  unsigned_long local_e8 [8];
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  ulong local_78;
  size_t local_20;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_10;
  
  local_10 = in_RSI;
  local_20 = Indices::size(in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffdb0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffda8.m_matrix);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffdb0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffda8.m_matrix);
  for (local_78 = 0; local_78 < local_20; local_78 = local_78 + 1) {
    in_stack_fffffffffffffe08 = local_10;
    iVar1 = Indices::operator[]((Indices *)in_stack_fffffffffffffdb8.m_matrix,
                                (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    (**(code **)(*(long *)in_stack_fffffffffffffe08 + 0x10))
              (local_90,in_stack_fffffffffffffe08,(long)iVar1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              (in_stack_fffffffffffffdd0,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    pMVar4 = local_10;
    iVar1 = Indices::operator[]((Indices *)in_stack_fffffffffffffdb8.m_matrix,
                                (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    (**(code **)(*(long *)pMVar4 + 0x18))(local_a8,pMVar4,(long)iVar1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              (in_stack_fffffffffffffdd0,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  }
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffdb0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffda8.m_matrix);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(in_stack_fffffffffffffe08,local_e8);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffdb0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffda8.m_matrix);
  local_104 = 3;
  local_108 = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffdd0,
             (int *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (in_stack_fffffffffffffdb0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffffda8.m_matrix);
  PVar3.m_rhs.m_matrix = in_stack_fffffffffffffda8.m_matrix;
  PVar3.m_lhs = (LhsNested)in_stack_fffffffffffffdb0;
  for (local_130 = 0; local_130 < local_20; local_130 = local_130 + 1) {
    other = local_10;
    iVar1 = Indices::operator[]((Indices *)in_stack_fffffffffffffdb8.m_matrix,PVar3.m_lhs._4_4_);
    (**(code **)(*(long *)other + 0x10))(local_178,other,(long)iVar1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               CONCAT44(iVar1,in_stack_fffffffffffffdd8),other);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (PVar3.m_lhs,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)PVar3.m_rhs.m_matrix.m_matrix);
    pMVar4 = local_10;
    iVar2 = Indices::operator[]((Indices *)in_stack_fffffffffffffdb8.m_matrix,PVar3.m_lhs._4_4_);
    (**(code **)(*(long *)pMVar4 + 0x18))(local_1c0,pMVar4,(long)iVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               CONCAT44(iVar1,in_stack_fffffffffffffdd8),other);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (PVar3.m_lhs,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)PVar3.m_rhs.m_matrix.m_matrix);
    in_stack_fffffffffffffdb8 =
         Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                   ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                    PVar3.m_rhs.m_matrix.m_matrix);
    PVar3 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar3.m_lhs,
                       (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                       PVar3.m_rhs.m_matrix.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  }
  math::arun(in_stack_00000298);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb9ae3f);
  return in_RDI;
}

Assistant:

rotation_t rotationOnly(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 2);

  Eigen::Vector3d pointsCenter1 = Eigen::Vector3d::Zero();
  Eigen::Vector3d pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getBearingVector1(indices[i]);
    pointsCenter2 += adapter.getBearingVector2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f = adapter.getBearingVector1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime =
        adapter.getBearingVector2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  return math::arun(Hcross);
}